

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

int16_t calc_slot_snare(EOPLL *opll)

{
  int16_t iVar1;
  uint local_1c;
  uint32_t phase;
  EOPLL_SLOT *slot;
  EOPLL *opll_local;
  
  if ((opll->slot[0xf].pg_out >> 8 & 1) == 0) {
    local_1c = 0x100;
    if ((opll->noise & 1) != 0) {
      local_1c = 0;
    }
  }
  else {
    local_1c = 0x200;
    if ((opll->noise & 1) != 0) {
      local_1c = 0x300;
    }
  }
  iVar1 = to_linear(opll->slot[0xf].wave_table[local_1c],opll->slot + 0xf,0);
  return iVar1;
}

Assistant:

static INLINE int16_t calc_slot_snare(EOPLL *opll) {
  EOPLL_SLOT *slot = CAR(opll, 7);

  uint32_t phase;

  if (BIT(slot->pg_out, PG_BITS - 2))
    phase = (opll->noise & 1) ? _PD(0x300) : _PD(0x200);
  else
    phase = (opll->noise & 1) ? _PD(0x0) : _PD(0x100);

  return to_linear(slot->wave_table[phase], slot, 0);
}